

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::PixelGameEngine::DrawString
          (PixelGameEngine *this,int32_t x,int32_t y,string *sText,Pixel col,uint32_t scale)

{
  char cVar1;
  Mode m_00;
  bool bVar2;
  int iVar3;
  Pixel PVar4;
  reference pcVar5;
  int iVar6;
  char local_80;
  uint local_7c;
  uint local_78;
  uint32_t j_1;
  uint32_t i_1;
  uint local_6c;
  uint32_t js;
  uint32_t is;
  uint local_60;
  uint32_t j;
  uint32_t i;
  int32_t oy;
  int32_t ox;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  Mode m;
  int32_t sy;
  int32_t sx;
  uint32_t scale_local;
  string *sText_local;
  int32_t y_local;
  int32_t x_local;
  PixelGameEngine *this_local;
  Pixel col_local;
  
  m = NORMAL;
  __range1._4_4_ = 0;
  m_00 = this->nPixelMode;
  if (m_00 != CUSTOM) {
    this_local._7_1_ = col.field_0._3_1_;
    if (this_local._7_1_ == -1) {
      SetPixelMode(this,MASK);
    }
    else {
      SetPixelMode(this,ALPHA);
    }
  }
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _ox = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&ox), bVar2) {
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar5;
    if (cVar1 == '\n') {
      m = NORMAL;
      __range1._4_4_ = scale * 8 + __range1._4_4_;
    }
    else {
      iVar6 = (cVar1 + -0x20) % 0x10;
      iVar3 = (cVar1 + -0x20) / 0x10;
      if (scale < 2) {
        for (local_78 = 0; local_78 < 8; local_78 = local_78 + 1) {
          for (local_7c = 0; local_7c < 8; local_7c = local_7c + 1) {
            PVar4 = Sprite::GetPixel(this->fontSprite,local_78 + iVar6 * 8,local_7c + iVar3 * 8);
            local_80 = PVar4.field_0._0_1_;
            if (local_80 != '\0') {
              (*this->_vptr_PixelGameEngine[5])
                        (this,(ulong)(x + m + local_78),(ulong)(y + __range1._4_4_ + local_7c),
                         (ulong)(uint)col.field_0);
            }
          }
        }
      }
      else {
        for (local_60 = 0; local_60 < 8; local_60 = local_60 + 1) {
          for (is = 0; is < 8; is = is + 1) {
            PVar4 = Sprite::GetPixel(this->fontSprite,local_60 + iVar6 * 8,is + iVar3 * 8);
            js._0_1_ = PVar4.field_0._0_1_;
            if ((char)js != '\0') {
              for (local_6c = 0; local_6c < scale; local_6c = local_6c + 1) {
                for (i_1 = 0; i_1 < scale; i_1 = i_1 + 1) {
                  (*this->_vptr_PixelGameEngine[5])
                            (this,(ulong)(x + m + local_60 * scale + local_6c),
                             (ulong)(y + __range1._4_4_ + is * scale + i_1),(ulong)(uint)col.field_0
                            );
                }
              }
            }
          }
        }
      }
      m = scale * 8 + m;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  SetPixelMode(this,m_00);
  return;
}

Assistant:

void PixelGameEngine::DrawString(int32_t x, int32_t y, const std::string &sText, Pixel col, uint32_t scale)
	{
		int32_t sx = 0;
		int32_t sy = 0;
		Pixel::Mode m = nPixelMode;
		// Thanks @tucna, spotted bug with col.ALPHA :P
		if (m != Pixel::CUSTOM) // Thanks @Megarev, required for "shaders"
		{
			if (col.a != 255)
				SetPixelMode(Pixel::ALPHA);
			else
				SetPixelMode(Pixel::MASK);
		}
		for (auto c : sText)
		{
			if (c == '\n')
			{
				sx = 0;
				sy += 8 * scale;
			}
			else
			{
				int32_t ox = (c - 32) % 16;
				int32_t oy = (c - 32) / 16;

				if (scale > 1)
				{
					for (uint32_t i = 0; i < 8; i++)
						for (uint32_t j = 0; j < 8; j++)
							if (fontSprite->GetPixel(i + ox * 8, j + oy * 8).r > 0)
								for (uint32_t is = 0; is < scale; is++)
									for (uint32_t js = 0; js < scale; js++)
										Draw(x + sx + (i * scale) + is, y + sy + (j * scale) + js, col);
				}
				else
				{
					for (uint32_t i = 0; i < 8; i++)
						for (uint32_t j = 0; j < 8; j++)
							if (fontSprite->GetPixel(i + ox * 8, j + oy * 8).r > 0)
								Draw(x + sx + i, y + sy + j, col);
				}
				sx += 8 * scale;
			}
		}
		SetPixelMode(m);
	}